

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltwise_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::Eltwise_x86_avx::forward
          (Eltwise_x86_avx *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [12];
  undefined1 auVar22 [24];
  bool bVar23;
  float *pfVar24;
  undefined1 (*pauVar25) [32];
  size_type sVar26;
  undefined1 (*pauVar27) [12];
  undefined1 (*pauVar28) [16];
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long *in_RDI;
  int remain_7;
  float *outptr_23;
  float *ptr_23;
  int q_23;
  Mat *bottom_blob2_11;
  size_t b_11;
  int remain_6;
  float *outptr_22;
  float *ptr1_11;
  float *ptr_22;
  int q_22;
  Mat *bottom_blob1_11;
  int remain_5;
  float *outptr_21;
  float *ptr_21;
  int q_21;
  float coeff;
  Mat *bottom_blob2_10;
  size_t b_10;
  int remain_4;
  float *outptr_20;
  float *ptr1_10;
  float *ptr_20;
  int q_20;
  float coeff1;
  float coeff0;
  Mat *bottom_blob1_10;
  int remain_3;
  float *outptr_19;
  float *ptr_19;
  int q_19;
  Mat *bottom_blob2_9;
  size_t b_9;
  int remain_2;
  float *outptr_18;
  float *ptr1_9;
  float *ptr_18;
  int q_18;
  Mat *bottom_blob1_9;
  int remain_1;
  float *outptr_17;
  float *ptr_17;
  int q_17;
  Mat *bottom_blob2_8;
  size_t b_8;
  int remain;
  float *outptr_16;
  float *ptr1_8;
  float *ptr_16;
  int q_16;
  Mat *bottom_blob1_8;
  __m128 _p1_15;
  __m128 _p_15;
  int i_15;
  float *outptr_15;
  float *ptr_15;
  int q_15;
  Mat *bottom_blob2_7;
  size_t b_7;
  __m128 _p1_14;
  __m128 _p_14;
  int i_14;
  float *outptr_14;
  float *ptr1_7;
  float *ptr_14;
  int q_14;
  Mat *bottom_blob1_7;
  __m128 _p_13;
  __m128 _p1_13;
  int i_13;
  float *outptr_13;
  float *ptr_13;
  int q_13;
  __m128 _coeff_1;
  Mat *bottom_blob2_6;
  size_t b_6;
  __m128 _p1_12;
  __m128 _p_12;
  int i_12;
  float *outptr_12;
  float *ptr1_6;
  float *ptr_12;
  int q_12;
  __m128 _coeff1_1;
  __m128 _coeff0_1;
  Mat *bottom_blob1_6;
  __m128 _p1_11;
  __m128 _p_11;
  int i_11;
  float *outptr_11;
  float *ptr_11;
  int q_11;
  Mat *bottom_blob2_5;
  size_t b_5;
  __m128 _p1_10;
  __m128 _p_10;
  int i_10;
  float *outptr_10;
  float *ptr1_5;
  float *ptr_10;
  int q_10;
  Mat *bottom_blob1_5;
  __m128 _p1_9;
  __m128 _p_9;
  int i_9;
  float *outptr_9;
  float *ptr_9;
  int q_9;
  Mat *bottom_blob2_4;
  size_t b_4;
  __m128 _p1_8;
  __m128 _p_8;
  int i_8;
  float *outptr_8;
  float *ptr1_4;
  float *ptr_8;
  int q_8;
  Mat *bottom_blob1_4;
  __m256 _p1_7;
  __m256 _p_7;
  int i_7;
  float *outptr_7;
  float *ptr_7;
  int q_7;
  Mat *bottom_blob2_3;
  size_t b_3;
  __m256 _p1_6;
  __m256 _p_6;
  int i_6;
  float *outptr_6;
  float *ptr1_3;
  float *ptr_6;
  int q_6;
  Mat *bottom_blob1_3;
  __m256 _p1_5;
  __m256 _p_5;
  int i_5;
  float *outptr_5;
  float *ptr_5;
  int q_5;
  __m256 _coeff;
  Mat *bottom_blob2_2;
  size_t b_2;
  __m256 _p1_4;
  __m256 _p_4;
  int i_4;
  float *outptr_4;
  float *ptr1_2;
  float *ptr_4;
  int q_4;
  __m256 _coeff1;
  __m256 _coeff0;
  Mat *bottom_blob1_2;
  __m256 _p1_3;
  __m256 _p_3;
  int i_3;
  float *outptr_3;
  float *ptr_3;
  int q_3;
  Mat *bottom_blob2_1;
  size_t b_1;
  __m256 _p1_2;
  __m256 _p_2;
  int i_2;
  float *outptr_2;
  float *ptr1_1;
  float *ptr_2;
  int q_2;
  Mat *bottom_blob1_1;
  __m256 _p1_1;
  __m256 _p_1;
  int i_1;
  float *outptr_1;
  float *ptr_1;
  int q_1;
  Mat *bottom_blob2;
  size_t b;
  __m256 _p1;
  __m256 _p;
  int i;
  float *outptr;
  float *ptr1;
  float *ptr;
  int q;
  Mat *bottom_blob1;
  Mat *top_blob;
  int size;
  int elempack;
  int channels;
  int h;
  int w;
  Mat *bottom_blob;
  Mat *in_stack_ffffffffffffd768;
  Allocator *in_stack_ffffffffffffd778;
  Mat *in_stack_ffffffffffffd780;
  ulong uVar29;
  Mat *in_stack_ffffffffffffd788;
  int _c;
  Mat *in_stack_ffffffffffffd790;
  int local_2454;
  Mat local_2450;
  float *local_2408;
  Mat local_2400;
  float *local_23b8;
  int local_23ac;
  const_reference local_23a8;
  ulong local_23a0;
  int local_2394;
  Mat local_2390;
  Mat *local_2348;
  Mat local_2340;
  float *local_22f8;
  Mat local_22f0;
  float *local_22a8;
  int local_229c;
  const_reference local_2298;
  int local_228c;
  Mat local_2288;
  float *local_2240;
  Mat local_2238;
  float *local_21f0;
  int local_21e8;
  float local_21e4;
  const_reference local_21e0;
  ulong local_21d8;
  int local_21cc;
  Mat local_21c8;
  float *local_2180;
  Mat local_2178;
  float *local_2130;
  Mat local_2128;
  float *local_20e0;
  int local_20d4;
  float local_20d0;
  float local_20cc;
  const_reference local_20c8;
  int local_20bc;
  Mat local_20b8;
  float *local_2070;
  Mat local_2068;
  float *local_2020;
  int local_2014;
  const_reference local_2010;
  ulong local_2008;
  int local_1ffc;
  Mat local_1ff8;
  float *local_1fb0;
  Mat local_1fa8;
  float *local_1f60;
  Mat local_1f58;
  float *local_1f10;
  int local_1f04;
  const_reference local_1f00;
  int local_1ef4;
  Mat local_1ef0;
  float *local_1ea8;
  Mat local_1ea0;
  float *local_1e58;
  int local_1e4c;
  const_reference local_1e48;
  ulong local_1e40;
  int local_1e34;
  Mat local_1e30;
  float *local_1de8;
  Mat local_1de0;
  float *local_1d98;
  Mat local_1d90;
  float *local_1d48;
  int local_1d3c;
  const_reference local_1d38;
  undefined8 local_1d30;
  undefined8 uStack_1d28;
  undefined1 local_1d20 [16];
  int local_1d0c;
  Mat local_1d08;
  undefined1 (*local_1cc0) [16];
  Mat local_1cb8;
  undefined1 (*local_1c70) [16];
  int local_1c64;
  const_reference local_1c60;
  ulong local_1c58;
  undefined8 local_1c50;
  undefined8 uStack_1c48;
  undefined1 local_1c40 [16];
  int local_1c24;
  Mat local_1c20;
  undefined1 (*local_1bd8) [16];
  Mat local_1bd0;
  undefined1 (*local_1b88) [16];
  Mat local_1b80;
  undefined1 (*local_1b38) [16];
  int local_1b2c;
  const_reference local_1b28;
  undefined8 local_1b20;
  undefined8 uStack_1b18;
  float local_1b10;
  float fStack_1b0c;
  float fStack_1b08;
  float fStack_1b04;
  int local_1afc;
  Mat local_1af8;
  undefined1 (*local_1ab0) [16];
  Mat local_1aa8;
  float *local_1a60;
  int local_1a54;
  undefined1 local_1a50 [16];
  const_reference local_1a40;
  ulong local_1a38;
  float local_1a30;
  float fStack_1a2c;
  float fStack_1a28;
  float fStack_1a24;
  undefined8 local_1a20;
  undefined8 uStack_1a18;
  int local_1a0c;
  Mat local_1a08;
  undefined1 (*local_19c0) [16];
  Mat local_19b8;
  float *local_1970;
  Mat local_1968;
  float *local_1920;
  int local_1914;
  undefined1 local_1910 [16];
  undefined8 local_1900;
  undefined8 uStack_18f8;
  const_reference local_18e8;
  undefined8 local_18e0;
  undefined8 uStack_18d8;
  float local_18d0;
  float fStack_18cc;
  float fStack_18c8;
  float fStack_18c4;
  int local_18bc;
  Mat local_18b8;
  undefined1 (*local_1870) [16];
  Mat local_1868;
  float *local_1820;
  int local_1814;
  const_reference local_1810;
  ulong local_1808;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  float local_17f0;
  float fStack_17ec;
  float fStack_17e8;
  float fStack_17e4;
  int local_17d4;
  Mat local_17d0;
  undefined1 (*local_1788) [16];
  Mat local_1780;
  float *local_1738;
  Mat local_1730;
  undefined1 (*local_16e8) [12];
  int local_16dc;
  const_reference local_16d8;
  undefined8 local_16d0;
  undefined8 uStack_16c8;
  float local_16c0;
  float fStack_16bc;
  float fStack_16b8;
  float fStack_16b4;
  int local_16ac;
  Mat local_16a8;
  undefined1 (*local_1660) [16];
  Mat local_1658;
  float *local_1610;
  int local_1604;
  const_reference local_1600;
  ulong local_15f8;
  undefined8 local_15f0;
  undefined8 uStack_15e8;
  float local_15e0;
  float fStack_15dc;
  float fStack_15d8;
  float fStack_15d4;
  int local_15c4;
  Mat local_15c0;
  undefined1 (*local_1578) [16];
  Mat local_1570;
  float *local_1528;
  Mat local_1520;
  undefined1 (*local_14d8) [12];
  int local_14cc;
  const_reference local_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined1 local_14a0 [32];
  int local_147c;
  Mat local_1478;
  undefined1 (*local_1430) [32];
  Mat local_1428;
  undefined1 (*local_13e0) [32];
  int local_13d4;
  const_reference local_13d0;
  ulong local_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined1 local_13a0 [32];
  int local_1364;
  Mat local_1360;
  undefined1 (*local_1318) [32];
  Mat local_1310;
  undefined1 (*local_12c8) [32];
  Mat local_12c0;
  undefined1 (*local_1278) [32];
  int local_126c;
  const_reference local_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  int local_120c;
  Mat local_1208;
  undefined1 (*local_11c0) [32];
  Mat local_11b8;
  float *local_1170;
  int local_1164;
  undefined1 local_1160 [32];
  const_reference local_1130;
  ulong local_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  int local_10dc;
  Mat local_10d8;
  undefined1 (*local_1090) [32];
  Mat local_1088;
  float *local_1040;
  Mat local_1038;
  float *local_ff0;
  int local_fe4;
  undefined1 local_fe0 [32];
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  const_reference local_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  int local_f3c;
  Mat local_f38;
  undefined1 (*local_ef0) [32];
  Mat local_ee8;
  float *local_ea0;
  int local_e94;
  const_reference local_e90;
  ulong local_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  int local_e24;
  Mat local_e20;
  undefined1 (*local_dd8) [32];
  Mat local_dd0;
  float *local_d88;
  Mat local_d80;
  float *local_d38;
  int local_d2c;
  const_reference local_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  int local_cdc;
  Mat local_cd8;
  undefined1 (*local_c90) [32];
  Mat local_c88;
  float *local_c40;
  int local_c34;
  const_reference local_c30;
  ulong local_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  int local_bc4;
  Mat local_bc0;
  undefined1 (*local_b78) [32];
  Mat local_b70;
  float *local_b28;
  Mat local_b10;
  float *local_ac8;
  int local_abc;
  const_reference local_ab8;
  reference local_ab0;
  int local_aa4;
  int local_aa0;
  int local_a9c;
  int local_a98;
  int local_a94;
  const_reference local_a90;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_a80;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_a78;
  int local_a64;
  undefined1 (*local_a60) [32];
  undefined1 (*local_a58) [32];
  undefined1 (*local_a50) [32];
  undefined1 (*local_a48) [32];
  float *local_a40;
  undefined1 (*local_a38) [32];
  float *local_a30;
  float *local_a28;
  float *local_a20;
  undefined1 (*local_a18) [32];
  float *local_a10;
  float *local_a08;
  float *local_a00;
  undefined1 (*local_9f8) [32];
  float *local_9f0;
  float *local_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined1 (*local_8e8) [32];
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined1 (*local_8a8) [32];
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined1 (*local_868) [32];
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined1 (*local_828) [32];
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined1 (*local_7e8) [32];
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined1 (*local_7a8) [32];
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined1 (*local_768) [32];
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined1 (*local_728) [32];
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  float local_68c;
  float local_688;
  float local_684;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined1 (*local_440) [16];
  undefined1 (*local_438) [16];
  undefined1 (*local_430) [16];
  undefined1 (*local_428) [16];
  undefined1 (*local_420) [16];
  float *local_418;
  float *local_410;
  float *local_408;
  float *local_400;
  undefined1 (*local_3f8) [16];
  float *local_3f0;
  undefined1 (*local_3e8) [12];
  float *local_3e0;
  undefined1 (*local_3d8) [16];
  float *local_3d0;
  undefined1 (*local_3c8) [12];
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined1 local_350 [8];
  float fStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined1 local_330 [8];
  float fStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined1 (*local_308) [16];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined1 (*local_2e8) [16];
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined1 (*local_2c8) [16];
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined1 (*local_2a8) [16];
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined1 (*local_288) [16];
  undefined8 local_280;
  undefined8 uStack_278;
  undefined1 (*local_268) [16];
  undefined8 local_260;
  undefined8 uStack_258;
  undefined1 (*local_248) [16];
  undefined8 local_240;
  undefined8 uStack_238;
  undefined1 (*local_228) [16];
  undefined8 local_220;
  undefined8 uStack_218;
  undefined1 local_210 [16];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined1 local_1f0 [16];
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined1 local_1d0 [8];
  float fStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined1 local_1b0 [8];
  float fStack_1a8;
  float local_1a0;
  float fStack_19c;
  float fStack_198;
  float fStack_194;
  float local_184;
  float local_180;
  float fStack_17c;
  float fStack_178;
  float fStack_174;
  float local_164;
  float local_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  float local_144;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined1 local_100 [16];
  undefined1 auStack_f0 [16];
  float local_e0;
  float local_dc;
  float local_d8;
  float local_d4;
  float local_d0;
  float local_cc;
  float local_c8;
  float local_c4;
  undefined1 local_c0 [32];
  float local_a0;
  float local_9c;
  float local_98;
  float local_94;
  float local_90;
  float local_8c;
  float local_88;
  float local_84;
  undefined1 local_80 [32];
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  
  local_a80 = in_RDX;
  local_a78 = in_RSI;
  local_a90 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_a94 = local_a90->w;
  local_a98 = local_a90->h;
  local_a9c = local_a90->c;
  local_aa0 = local_a90->elempack;
  local_aa4 = local_a94 * local_a98;
  local_ab0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_a80,0);
  ncnn::Mat::create_like
            (in_stack_ffffffffffffd788,in_stack_ffffffffffffd780,in_stack_ffffffffffffd778);
  bVar23 = ncnn::Mat::empty(in_stack_ffffffffffffd768);
  if (bVar23) {
    local_a64 = -100;
  }
  else if (local_aa0 == 8) {
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 0) {
      local_ab8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_a78,1);
      for (local_abc = 0; local_abc < local_a9c; local_abc = local_abc + 1) {
        ncnn::Mat::channel(in_stack_ffffffffffffd790,(int)((ulong)in_stack_ffffffffffffd788 >> 0x20)
                          );
        pfVar24 = ncnn::Mat::operator_cast_to_float_(&local_b10);
        ncnn::Mat::~Mat((Mat *)0x385e22);
        local_ac8 = pfVar24;
        ncnn::Mat::channel(in_stack_ffffffffffffd790,(int)((ulong)in_stack_ffffffffffffd788 >> 0x20)
                          );
        pfVar24 = ncnn::Mat::operator_cast_to_float_(&local_b70);
        ncnn::Mat::~Mat((Mat *)0x385e7a);
        local_b28 = pfVar24;
        ncnn::Mat::channel(in_stack_ffffffffffffd790,(int)((ulong)in_stack_ffffffffffffd788 >> 0x20)
                          );
        pauVar25 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_bc0);
        ncnn::Mat::~Mat((Mat *)0x385ed2);
        local_b78 = pauVar25;
        for (local_bc4 = 0; local_bc4 < local_aa4; local_bc4 = local_bc4 + 1) {
          local_9e8 = local_ac8;
          uVar3 = *(undefined8 *)local_ac8;
          uVar4 = *(undefined8 *)(local_ac8 + 2);
          uVar5 = *(undefined8 *)(local_ac8 + 4);
          uVar6 = *(undefined8 *)(local_ac8 + 6);
          local_9f0 = local_b28;
          local_c20 = *(undefined8 *)local_b28;
          uStack_c18 = *(undefined8 *)(local_b28 + 2);
          uStack_c10 = *(undefined8 *)(local_b28 + 4);
          uStack_c08 = *(undefined8 *)(local_b28 + 6);
          local_940._0_4_ = (float)uVar3;
          local_940._4_4_ = (float)((ulong)uVar3 >> 0x20);
          uStack_938._0_4_ = (float)uVar4;
          uStack_938._4_4_ = (float)((ulong)uVar4 >> 0x20);
          uStack_930._0_4_ = (float)uVar5;
          uStack_930._4_4_ = (float)((ulong)uVar5 >> 0x20);
          uStack_928._0_4_ = (float)uVar6;
          uStack_928._4_4_ = (undefined4)((ulong)uVar6 >> 0x20);
          local_960._0_4_ = (float)local_c20;
          local_960._4_4_ = (float)((ulong)local_c20 >> 0x20);
          uStack_958._0_4_ = (float)uStack_c18;
          uStack_958._4_4_ = (float)((ulong)uStack_c18 >> 0x20);
          uStack_950._0_4_ = (float)uStack_c10;
          uStack_950._4_4_ = (float)((ulong)uStack_c10 >> 0x20);
          uStack_948._0_4_ = (float)uStack_c08;
          local_c00 = CONCAT44(local_940._4_4_ * local_960._4_4_,(float)local_940 * (float)local_960
                              );
          uStack_bf8 = CONCAT44(uStack_938._4_4_ * uStack_958._4_4_,
                                (float)uStack_938 * (float)uStack_958);
          uStack_bf0 = CONCAT44(uStack_930._4_4_ * uStack_950._4_4_,
                                (float)uStack_930 * (float)uStack_950);
          uStack_be8 = CONCAT44(uStack_928._4_4_,(float)uStack_928 * (float)uStack_948);
          local_728 = local_b78;
          local_760 = local_c00;
          uStack_758 = uStack_bf8;
          uStack_750 = uStack_bf0;
          uStack_748 = uStack_be8;
          auVar15._8_8_ = uStack_bf8;
          auVar15._0_8_ = local_c00;
          auVar15._16_8_ = uStack_bf0;
          auVar15._24_8_ = uStack_be8;
          *local_b78 = auVar15;
          local_ac8 = local_ac8 + 8;
          local_b28 = local_b28 + 8;
          local_b78 = local_b78 + 1;
          local_960 = local_c20;
          uStack_958 = uStack_c18;
          uStack_950 = uStack_c10;
          uStack_948 = uStack_c08;
          local_940 = uVar3;
          uStack_938 = uVar4;
          uStack_930 = uVar5;
          uStack_928 = uVar6;
        }
      }
      for (local_c28 = 2; uVar29 = local_c28,
          sVar26 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_a78),
          uVar29 < sVar26; local_c28 = local_c28 + 1) {
        local_c30 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                              (local_a78,local_c28);
        for (local_c34 = 0; local_c34 < local_a9c; local_c34 = local_c34 + 1) {
          ncnn::Mat::channel(in_stack_ffffffffffffd790,
                             (int)((ulong)in_stack_ffffffffffffd788 >> 0x20));
          pfVar24 = ncnn::Mat::operator_cast_to_float_(&local_c88);
          ncnn::Mat::~Mat((Mat *)0x386164);
          local_c40 = pfVar24;
          ncnn::Mat::channel(in_stack_ffffffffffffd790,
                             (int)((ulong)in_stack_ffffffffffffd788 >> 0x20));
          pauVar25 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_cd8);
          ncnn::Mat::~Mat((Mat *)0x3861bc);
          local_c90 = pauVar25;
          for (local_cdc = 0; local_cdc < local_aa4; local_cdc = local_cdc + 1) {
            local_9f8 = local_c90;
            uVar3 = *(undefined8 *)*local_c90;
            uVar4 = *(undefined8 *)(*local_c90 + 8);
            uVar5 = *(undefined8 *)(*local_c90 + 0x10);
            uVar6 = *(undefined8 *)(*local_c90 + 0x18);
            local_a00 = local_c40;
            local_d20 = *(undefined8 *)local_c40;
            uStack_d18 = *(undefined8 *)(local_c40 + 2);
            uStack_d10 = *(undefined8 *)(local_c40 + 4);
            uStack_d08 = *(undefined8 *)(local_c40 + 6);
            local_980._0_4_ = (float)uVar3;
            local_980._4_4_ = (float)((ulong)uVar3 >> 0x20);
            uStack_978._0_4_ = (float)uVar4;
            uStack_978._4_4_ = (float)((ulong)uVar4 >> 0x20);
            uStack_970._0_4_ = (float)uVar5;
            uStack_970._4_4_ = (float)((ulong)uVar5 >> 0x20);
            uStack_968._0_4_ = (float)uVar6;
            uStack_968._4_4_ = (undefined4)((ulong)uVar6 >> 0x20);
            local_9a0._0_4_ = (float)local_d20;
            local_9a0._4_4_ = (float)((ulong)local_d20 >> 0x20);
            uStack_998._0_4_ = (float)uStack_d18;
            uStack_998._4_4_ = (float)((ulong)uStack_d18 >> 0x20);
            uStack_990._0_4_ = (float)uStack_d10;
            uStack_990._4_4_ = (float)((ulong)uStack_d10 >> 0x20);
            uStack_988._0_4_ = (float)uStack_d08;
            local_d00 = CONCAT44(local_980._4_4_ * local_9a0._4_4_,
                                 (float)local_980 * (float)local_9a0);
            uStack_cf8 = CONCAT44(uStack_978._4_4_ * uStack_998._4_4_,
                                  (float)uStack_978 * (float)uStack_998);
            uStack_cf0 = CONCAT44(uStack_970._4_4_ * uStack_990._4_4_,
                                  (float)uStack_970 * (float)uStack_990);
            uStack_ce8 = CONCAT44(uStack_968._4_4_,(float)uStack_968 * (float)uStack_988);
            local_768 = local_c90;
            local_7a0 = local_d00;
            uStack_798 = uStack_cf8;
            uStack_790 = uStack_cf0;
            uStack_788 = uStack_ce8;
            auVar14._8_8_ = uStack_cf8;
            auVar14._0_8_ = local_d00;
            auVar14._16_8_ = uStack_cf0;
            auVar14._24_8_ = uStack_ce8;
            *local_c90 = auVar14;
            local_c40 = local_c40 + 8;
            local_c90 = local_c90 + 1;
            local_9a0 = local_d20;
            uStack_998 = uStack_d18;
            uStack_990 = uStack_d10;
            uStack_988 = uStack_d08;
            local_980 = uVar3;
            uStack_978 = uVar4;
            uStack_970 = uVar5;
            uStack_968 = uVar6;
          }
        }
      }
    }
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 1) {
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x104) == 0) {
        local_d28 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_a78,1);
        for (local_d2c = 0; local_d2c < local_a9c; local_d2c = local_d2c + 1) {
          ncnn::Mat::channel(in_stack_ffffffffffffd790,
                             (int)((ulong)in_stack_ffffffffffffd788 >> 0x20));
          pfVar24 = ncnn::Mat::operator_cast_to_float_(&local_d80);
          ncnn::Mat::~Mat((Mat *)0x386428);
          local_d38 = pfVar24;
          ncnn::Mat::channel(in_stack_ffffffffffffd790,
                             (int)((ulong)in_stack_ffffffffffffd788 >> 0x20));
          pfVar24 = ncnn::Mat::operator_cast_to_float_(&local_dd0);
          ncnn::Mat::~Mat((Mat *)0x386480);
          local_d88 = pfVar24;
          ncnn::Mat::channel(in_stack_ffffffffffffd790,
                             (int)((ulong)in_stack_ffffffffffffd788 >> 0x20));
          pauVar25 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_e20);
          ncnn::Mat::~Mat((Mat *)0x3864d8);
          local_dd8 = pauVar25;
          for (local_e24 = 0; local_e24 < local_aa4; local_e24 = local_e24 + 1) {
            local_a08 = local_d38;
            uVar3 = *(undefined8 *)local_d38;
            uVar4 = *(undefined8 *)(local_d38 + 2);
            uVar5 = *(undefined8 *)(local_d38 + 4);
            uVar6 = *(undefined8 *)(local_d38 + 6);
            local_a10 = local_d88;
            local_e80 = *(undefined8 *)local_d88;
            uStack_e78 = *(undefined8 *)(local_d88 + 2);
            uStack_e70 = *(undefined8 *)(local_d88 + 4);
            uStack_e68 = *(undefined8 *)(local_d88 + 6);
            local_6c0._0_4_ = (float)uVar3;
            local_6c0._4_4_ = (float)((ulong)uVar3 >> 0x20);
            uStack_6b8._0_4_ = (float)uVar4;
            uStack_6b8._4_4_ = (float)((ulong)uVar4 >> 0x20);
            uStack_6b0._0_4_ = (float)uVar5;
            uStack_6b0._4_4_ = (float)((ulong)uVar5 >> 0x20);
            uStack_6a8._0_4_ = (float)uVar6;
            uStack_6a8._4_4_ = (float)((ulong)uVar6 >> 0x20);
            local_6e0._0_4_ = (float)local_e80;
            local_6e0._4_4_ = (float)((ulong)local_e80 >> 0x20);
            uStack_6d8._0_4_ = (float)uStack_e78;
            uStack_6d8._4_4_ = (float)((ulong)uStack_e78 >> 0x20);
            uStack_6d0._0_4_ = (float)uStack_e70;
            uStack_6d0._4_4_ = (float)((ulong)uStack_e70 >> 0x20);
            uStack_6c8._0_4_ = (float)uStack_e68;
            uStack_6c8._4_4_ = (float)((ulong)uStack_e68 >> 0x20);
            local_e60 = CONCAT44(local_6c0._4_4_ + local_6e0._4_4_,
                                 (float)local_6c0 + (float)local_6e0);
            uStack_e58 = CONCAT44(uStack_6b8._4_4_ + uStack_6d8._4_4_,
                                  (float)uStack_6b8 + (float)uStack_6d8);
            uStack_e50 = CONCAT44(uStack_6b0._4_4_ + uStack_6d0._4_4_,
                                  (float)uStack_6b0 + (float)uStack_6d0);
            uStack_e48 = CONCAT44(uStack_6a8._4_4_ + uStack_6c8._4_4_,
                                  (float)uStack_6a8 + (float)uStack_6c8);
            local_7a8 = local_dd8;
            local_7e0 = local_e60;
            uStack_7d8 = uStack_e58;
            uStack_7d0 = uStack_e50;
            uStack_7c8 = uStack_e48;
            auVar13._8_8_ = uStack_e58;
            auVar13._0_8_ = local_e60;
            auVar13._16_8_ = uStack_e50;
            auVar13._24_8_ = uStack_e48;
            *local_dd8 = auVar13;
            local_d38 = local_d38 + 8;
            local_d88 = local_d88 + 8;
            local_dd8 = local_dd8 + 1;
            local_6e0 = local_e80;
            uStack_6d8 = uStack_e78;
            uStack_6d0 = uStack_e70;
            uStack_6c8 = uStack_e68;
            local_6c0 = uVar3;
            uStack_6b8 = uVar4;
            uStack_6b0 = uVar5;
            uStack_6a8 = uVar6;
          }
        }
        for (local_e88 = 2; uVar29 = local_e88,
            sVar26 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_a78),
            uVar29 < sVar26; local_e88 = local_e88 + 1) {
          local_e90 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                (local_a78,local_e88);
          for (local_e94 = 0; local_e94 < local_a9c; local_e94 = local_e94 + 1) {
            ncnn::Mat::channel(in_stack_ffffffffffffd790,
                               (int)((ulong)in_stack_ffffffffffffd788 >> 0x20));
            pfVar24 = ncnn::Mat::operator_cast_to_float_(&local_ee8);
            ncnn::Mat::~Mat((Mat *)0x38676a);
            local_ea0 = pfVar24;
            ncnn::Mat::channel(in_stack_ffffffffffffd790,
                               (int)((ulong)in_stack_ffffffffffffd788 >> 0x20));
            pauVar25 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_f38);
            ncnn::Mat::~Mat((Mat *)0x3867c2);
            local_ef0 = pauVar25;
            for (local_f3c = 0; local_f3c < local_aa4; local_f3c = local_f3c + 1) {
              local_a18 = local_ef0;
              uVar3 = *(undefined8 *)*local_ef0;
              uVar4 = *(undefined8 *)(*local_ef0 + 8);
              uVar5 = *(undefined8 *)(*local_ef0 + 0x10);
              uVar6 = *(undefined8 *)(*local_ef0 + 0x18);
              local_a20 = local_ea0;
              local_f80 = *(undefined8 *)local_ea0;
              uStack_f78 = *(undefined8 *)(local_ea0 + 2);
              uStack_f70 = *(undefined8 *)(local_ea0 + 4);
              uStack_f68 = *(undefined8 *)(local_ea0 + 6);
              local_700._0_4_ = (float)uVar3;
              local_700._4_4_ = (float)((ulong)uVar3 >> 0x20);
              uStack_6f8._0_4_ = (float)uVar4;
              uStack_6f8._4_4_ = (float)((ulong)uVar4 >> 0x20);
              uStack_6f0._0_4_ = (float)uVar5;
              uStack_6f0._4_4_ = (float)((ulong)uVar5 >> 0x20);
              uStack_6e8._0_4_ = (float)uVar6;
              uStack_6e8._4_4_ = (float)((ulong)uVar6 >> 0x20);
              local_720._0_4_ = (float)local_f80;
              local_720._4_4_ = (float)((ulong)local_f80 >> 0x20);
              uStack_718._0_4_ = (float)uStack_f78;
              uStack_718._4_4_ = (float)((ulong)uStack_f78 >> 0x20);
              uStack_710._0_4_ = (float)uStack_f70;
              uStack_710._4_4_ = (float)((ulong)uStack_f70 >> 0x20);
              uStack_708._0_4_ = (float)uStack_f68;
              uStack_708._4_4_ = (float)((ulong)uStack_f68 >> 0x20);
              local_f60 = CONCAT44(local_700._4_4_ + local_720._4_4_,
                                   (float)local_700 + (float)local_720);
              uStack_f58 = CONCAT44(uStack_6f8._4_4_ + uStack_718._4_4_,
                                    (float)uStack_6f8 + (float)uStack_718);
              uStack_f50 = CONCAT44(uStack_6f0._4_4_ + uStack_710._4_4_,
                                    (float)uStack_6f0 + (float)uStack_710);
              uStack_f48 = CONCAT44(uStack_6e8._4_4_ + uStack_708._4_4_,
                                    (float)uStack_6e8 + (float)uStack_708);
              local_7e8 = local_ef0;
              local_820 = local_f60;
              uStack_818 = uStack_f58;
              uStack_810 = uStack_f50;
              uStack_808 = uStack_f48;
              auVar12._8_8_ = uStack_f58;
              auVar12._0_8_ = local_f60;
              auVar12._16_8_ = uStack_f50;
              auVar12._24_8_ = uStack_f48;
              *local_ef0 = auVar12;
              local_ea0 = local_ea0 + 8;
              local_ef0 = local_ef0 + 1;
              local_720 = local_f80;
              uStack_718 = uStack_f78;
              uStack_710 = uStack_f70;
              uStack_708 = uStack_f68;
              local_700 = uVar3;
              uStack_6f8 = uVar4;
              uStack_6f0 = uVar5;
              uStack_6e8 = uVar6;
            }
          }
        }
      }
      else {
        local_f88 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_a78,1);
        pfVar24 = ncnn::Mat::operator[]((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8),0)
        ;
        local_684 = *pfVar24;
        auVar1 = vinsertps_avx(ZEXT416((uint)local_684),ZEXT416((uint)local_684),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_684),0x20);
        local_100 = vinsertps_avx(auVar1,ZEXT416((uint)local_684),0x30);
        auVar1 = vinsertps_avx(ZEXT416((uint)local_684),ZEXT416((uint)local_684),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_684),0x20);
        auStack_f0 = vinsertps_avx(auVar1,ZEXT416((uint)local_684),0x30);
        local_fc0 = local_100._0_8_;
        uStack_fb8 = local_100._8_8_;
        uStack_fb0 = auStack_f0._0_8_;
        uStack_fa8 = auStack_f0._8_8_;
        local_e0 = local_684;
        local_dc = local_684;
        local_d8 = local_684;
        local_d4 = local_684;
        local_d0 = local_684;
        local_cc = local_684;
        local_c8 = local_684;
        local_c4 = local_684;
        pfVar24 = ncnn::Mat::operator[]((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8),1)
        ;
        local_688 = *pfVar24;
        auVar1 = vinsertps_avx(ZEXT416((uint)local_688),ZEXT416((uint)local_688),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_688),0x20);
        auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_688),0x30);
        auVar2 = vinsertps_avx(ZEXT416((uint)local_688),ZEXT416((uint)local_688),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_688),0x20);
        auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_688),0x30);
        local_fe0._16_16_ = auVar1;
        local_fe0._0_16_ = auVar2;
        local_c0 = local_fe0;
        local_a0 = local_688;
        local_9c = local_688;
        local_98 = local_688;
        local_94 = local_688;
        local_90 = local_688;
        local_8c = local_688;
        local_88 = local_688;
        local_84 = local_688;
        for (local_fe4 = 0; local_fe4 < local_a9c; local_fe4 = local_fe4 + 1) {
          ncnn::Mat::channel(in_stack_ffffffffffffd790,
                             (int)((ulong)in_stack_ffffffffffffd788 >> 0x20));
          pfVar24 = ncnn::Mat::operator_cast_to_float_(&local_1038);
          ncnn::Mat::~Mat((Mat *)0x386c3b);
          local_ff0 = pfVar24;
          ncnn::Mat::channel(in_stack_ffffffffffffd790,
                             (int)((ulong)in_stack_ffffffffffffd788 >> 0x20));
          pfVar24 = ncnn::Mat::operator_cast_to_float_(&local_1088);
          ncnn::Mat::~Mat((Mat *)0x386c93);
          local_1040 = pfVar24;
          ncnn::Mat::channel(in_stack_ffffffffffffd790,
                             (int)((ulong)in_stack_ffffffffffffd788 >> 0x20));
          pauVar25 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_10d8);
          ncnn::Mat::~Mat((Mat *)0x386ceb);
          local_1090 = pauVar25;
          for (local_10dc = 0; local_10dc < local_aa4; local_10dc = local_10dc + 1) {
            local_a28 = local_ff0;
            uVar3 = *(undefined8 *)local_ff0;
            uVar4 = *(undefined8 *)(local_ff0 + 2);
            uVar5 = *(undefined8 *)(local_ff0 + 4);
            uVar6 = *(undefined8 *)(local_ff0 + 6);
            local_a30 = local_1040;
            local_1120 = *(undefined8 *)local_1040;
            uStack_1118 = *(undefined8 *)(local_1040 + 2);
            uStack_1110 = *(undefined8 *)(local_1040 + 4);
            uStack_1108 = *(undefined8 *)(local_1040 + 6);
            local_9c0._0_4_ = (float)uVar3;
            local_9c0._4_4_ = (float)((ulong)uVar3 >> 0x20);
            uStack_9b8._0_4_ = (float)uVar4;
            uStack_9b8._4_4_ = (float)((ulong)uVar4 >> 0x20);
            uStack_9b0._0_4_ = (float)uVar5;
            uStack_9b0._4_4_ = (float)((ulong)uVar5 >> 0x20);
            uStack_9a8._0_4_ = (float)uVar6;
            uStack_9a8._4_4_ = (float)((ulong)uVar6 >> 0x20);
            local_9e0._0_4_ = (float)local_fc0;
            local_9e0._4_4_ = (float)((ulong)local_fc0 >> 0x20);
            uStack_9d8._0_4_ = (float)uStack_fb8;
            uStack_9d8._4_4_ = (float)((ulong)uStack_fb8 >> 0x20);
            uStack_9d0._0_4_ = (float)uStack_fb0;
            uStack_9d0._4_4_ = (float)((ulong)uStack_fb0 >> 0x20);
            uStack_9c8._0_4_ = (float)uStack_fa8;
            local_1100 = CONCAT44(local_9c0._4_4_ * local_9e0._4_4_,
                                  (float)local_9c0 * (float)local_9e0);
            uStack_10f8 = CONCAT44(uStack_9b8._4_4_ * uStack_9d8._4_4_,
                                   (float)uStack_9b8 * (float)uStack_9d8);
            uStack_10f0 = CONCAT44(uStack_9b0._4_4_ * uStack_9d0._4_4_,
                                   (float)uStack_9b0 * (float)uStack_9d0);
            uStack_10e8 = CONCAT44(uStack_9a8._4_4_,(float)uStack_9a8 * (float)uStack_9c8);
            local_580 = local_fe0._0_8_;
            uStack_578 = local_fe0._8_8_;
            uStack_570 = local_fe0._16_8_;
            uStack_568 = local_fe0._24_8_;
            local_5a0 = local_1100;
            uStack_598 = uStack_10f8;
            uStack_590 = uStack_10f0;
            uStack_588 = uStack_10e8;
            local_560._0_4_ = (float)local_1120;
            local_520 = (float)local_560;
            local_560._4_4_ = (float)((ulong)local_1120 >> 0x20);
            fStack_51c = local_560._4_4_;
            uStack_558._0_4_ = (float)uStack_1118;
            fStack_518 = (float)uStack_558;
            uStack_558._4_4_ = (float)((ulong)uStack_1118 >> 0x20);
            fStack_514 = uStack_558._4_4_;
            uStack_550._0_4_ = (float)uStack_1110;
            fStack_510 = (float)uStack_550;
            uStack_550._4_4_ = (float)((ulong)uStack_1110 >> 0x20);
            fStack_50c = uStack_550._4_4_;
            uStack_548._0_4_ = (float)uStack_1108;
            fStack_508 = (float)uStack_548;
            uStack_548._4_4_ = (float)((ulong)uStack_1108 >> 0x20);
            fStack_504 = uStack_548._4_4_;
            local_540._0_4_ = local_fe0._0_4_;
            local_540._4_4_ = local_fe0._4_4_;
            uStack_538._0_4_ = local_fe0._8_4_;
            uStack_538._4_4_ = local_fe0._12_4_;
            uStack_530._0_4_ = local_fe0._16_4_;
            uStack_530._4_4_ = local_fe0._20_4_;
            uStack_528._0_4_ = local_fe0._24_4_;
            local_4e0 = (float)local_560 * (float)local_540;
            fStack_4dc = local_560._4_4_ * local_540._4_4_;
            fStack_4d8 = (float)uStack_558 * (float)uStack_538;
            fStack_4d4 = uStack_558._4_4_ * uStack_538._4_4_;
            fStack_4d0 = (float)uStack_550 * (float)uStack_530;
            fStack_4cc = uStack_550._4_4_ * uStack_530._4_4_;
            fStack_4c8 = (float)uStack_548 * (float)uStack_528;
            local_500 = local_1100;
            uStack_4f8 = uStack_10f8;
            uStack_4f0 = uStack_10f0;
            uStack_4e8 = uStack_10e8;
            local_1100 = CONCAT44(fStack_4dc + local_9c0._4_4_ * local_9e0._4_4_,
                                  local_4e0 + (float)local_9c0 * (float)local_9e0);
            uStack_10f8 = CONCAT44(fStack_4d4 + uStack_9b8._4_4_ * uStack_9d8._4_4_,
                                   fStack_4d8 + (float)uStack_9b8 * (float)uStack_9d8);
            uStack_10f0 = CONCAT44(fStack_4cc + uStack_9b0._4_4_ * uStack_9d0._4_4_,
                                   fStack_4d0 + (float)uStack_9b0 * (float)uStack_9d0);
            uStack_10e8 = CONCAT44(uStack_548._4_4_ + uStack_9a8._4_4_,
                                   fStack_4c8 + (float)uStack_9a8 * (float)uStack_9c8);
            local_828 = local_1090;
            local_860 = local_1100;
            uStack_858 = uStack_10f8;
            uStack_850 = uStack_10f0;
            uStack_848 = uStack_10e8;
            auVar11._8_8_ = uStack_10f8;
            auVar11._0_8_ = local_1100;
            auVar11._16_8_ = uStack_10f0;
            auVar11._24_8_ = uStack_10e8;
            *local_1090 = auVar11;
            local_ff0 = local_ff0 + 8;
            local_1040 = local_1040 + 8;
            local_1090 = local_1090 + 1;
            local_9e0 = local_fc0;
            uStack_9d8 = uStack_fb8;
            uStack_9d0 = uStack_fb0;
            uStack_9c8 = uStack_fa8;
            local_9c0 = uVar3;
            uStack_9b8 = uVar4;
            uStack_9b0 = uVar5;
            uStack_9a8 = uVar6;
            local_560 = local_1120;
            uStack_558 = uStack_1118;
            uStack_550 = uStack_1110;
            uStack_548 = uStack_1108;
            local_540 = local_fe0._0_8_;
            uStack_538 = local_fe0._8_8_;
            uStack_530 = local_fe0._16_8_;
            uStack_528 = local_fe0._24_8_;
            fStack_4c4 = fStack_504;
          }
        }
        for (local_1128 = 2; uVar29 = local_1128,
            sVar26 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_a78),
            uVar29 < sVar26; local_1128 = local_1128 + 1) {
          local_1130 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                 (local_a78,local_1128);
          pfVar24 = ncnn::Mat::operator[]
                              ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8),local_1128)
          ;
          local_68c = *pfVar24;
          auVar1 = vinsertps_avx(ZEXT416((uint)local_68c),ZEXT416((uint)local_68c),0x10);
          auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_68c),0x20);
          auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_68c),0x30);
          auVar2 = vinsertps_avx(ZEXT416((uint)local_68c),ZEXT416((uint)local_68c),0x10);
          auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_68c),0x20);
          auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_68c),0x30);
          local_1160._16_16_ = auVar1;
          local_1160._0_16_ = auVar2;
          local_80 = local_1160;
          local_50 = local_68c;
          local_4c = local_68c;
          local_48 = local_68c;
          local_44 = local_68c;
          local_40 = local_68c;
          local_3c = local_68c;
          local_38 = local_68c;
          local_34 = local_68c;
          for (local_1164 = 0; local_1164 < local_a9c; local_1164 = local_1164 + 1) {
            ncnn::Mat::channel(in_stack_ffffffffffffd790,
                               (int)((ulong)in_stack_ffffffffffffd788 >> 0x20));
            pfVar24 = ncnn::Mat::operator_cast_to_float_(&local_11b8);
            ncnn::Mat::~Mat((Mat *)0x38713e);
            local_1170 = pfVar24;
            ncnn::Mat::channel(in_stack_ffffffffffffd790,
                               (int)((ulong)in_stack_ffffffffffffd788 >> 0x20));
            pauVar25 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_1208);
            ncnn::Mat::~Mat((Mat *)0x387196);
            local_11c0 = pauVar25;
            for (local_120c = 0; local_120c < local_aa4; local_120c = local_120c + 1) {
              local_a38 = local_11c0;
              local_680 = *(undefined8 *)*local_11c0;
              uStack_678 = *(undefined8 *)(*local_11c0 + 8);
              uStack_670 = *(undefined8 *)(*local_11c0 + 0x10);
              uStack_668 = *(undefined8 *)(*local_11c0 + 0x18);
              local_a40 = local_1170;
              local_1260 = *(undefined8 *)local_1170;
              uStack_1258 = *(undefined8 *)(local_1170 + 2);
              uStack_1250 = *(undefined8 *)(local_1170 + 4);
              uStack_1248 = *(undefined8 *)(local_1170 + 6);
              local_660 = local_1160._0_8_;
              uStack_658 = local_1160._8_8_;
              uStack_650 = local_1160._16_8_;
              uStack_648 = local_1160._24_8_;
              local_640._0_4_ = (float)local_1260;
              local_600 = (float)local_640;
              local_640._4_4_ = (float)((ulong)local_1260 >> 0x20);
              fStack_5fc = local_640._4_4_;
              uStack_638._0_4_ = (float)uStack_1258;
              fStack_5f8 = (float)uStack_638;
              uStack_638._4_4_ = (float)((ulong)uStack_1258 >> 0x20);
              fStack_5f4 = uStack_638._4_4_;
              uStack_630._0_4_ = (float)uStack_1250;
              fStack_5f0 = (float)uStack_630;
              uStack_630._4_4_ = (float)((ulong)uStack_1250 >> 0x20);
              fStack_5ec = uStack_630._4_4_;
              uStack_628._0_4_ = (float)uStack_1248;
              fStack_5e8 = (float)uStack_628;
              uStack_628._4_4_ = (float)((ulong)uStack_1248 >> 0x20);
              fStack_5e4 = uStack_628._4_4_;
              local_620._0_4_ = local_1160._0_4_;
              local_620._4_4_ = local_1160._4_4_;
              uStack_618._0_4_ = local_1160._8_4_;
              uStack_618._4_4_ = local_1160._12_4_;
              uStack_610._0_4_ = local_1160._16_4_;
              uStack_610._4_4_ = local_1160._20_4_;
              uStack_608._0_4_ = local_1160._24_4_;
              local_5c0 = (float)local_640 * (float)local_620;
              fStack_5bc = local_640._4_4_ * local_620._4_4_;
              fStack_5b8 = (float)uStack_638 * (float)uStack_618;
              fStack_5b4 = uStack_638._4_4_ * uStack_618._4_4_;
              fStack_5b0 = (float)uStack_630 * (float)uStack_610;
              fStack_5ac = uStack_630._4_4_ * uStack_610._4_4_;
              fStack_5a8 = (float)uStack_628 * (float)uStack_608;
              local_5e0._0_4_ = (float)local_680;
              local_5e0._4_4_ = (float)((ulong)local_680 >> 0x20);
              uStack_5d8._0_4_ = (float)uStack_678;
              uStack_5d8._4_4_ = (float)((ulong)uStack_678 >> 0x20);
              uStack_5d0._0_4_ = (float)uStack_670;
              uStack_5d0._4_4_ = (float)((ulong)uStack_670 >> 0x20);
              uStack_5c8._0_4_ = (float)uStack_668;
              uStack_5c8._4_4_ = (float)((ulong)uStack_668 >> 0x20);
              local_1240 = CONCAT44(fStack_5bc + local_5e0._4_4_,local_5c0 + (float)local_5e0);
              uStack_1238 = CONCAT44(fStack_5b4 + uStack_5d8._4_4_,fStack_5b8 + (float)uStack_5d8);
              uStack_1230 = CONCAT44(fStack_5ac + uStack_5d0._4_4_,fStack_5b0 + (float)uStack_5d0);
              uStack_1228 = CONCAT44(uStack_628._4_4_ + uStack_5c8._4_4_,
                                     fStack_5a8 + (float)uStack_5c8);
              local_868 = local_11c0;
              local_8a0 = local_1240;
              uStack_898 = uStack_1238;
              uStack_890 = uStack_1230;
              uStack_888 = uStack_1228;
              auVar10._8_8_ = uStack_1238;
              auVar10._0_8_ = local_1240;
              auVar10._16_8_ = uStack_1230;
              auVar10._24_8_ = uStack_1228;
              *local_11c0 = auVar10;
              local_1170 = local_1170 + 8;
              local_11c0 = local_11c0 + 1;
              local_640 = local_1260;
              uStack_638 = uStack_1258;
              uStack_630 = uStack_1250;
              uStack_628 = uStack_1248;
              local_620 = local_1160._0_8_;
              uStack_618 = local_1160._8_8_;
              uStack_610 = local_1160._16_8_;
              uStack_608 = local_1160._24_8_;
              local_5e0 = local_680;
              uStack_5d8 = uStack_678;
              uStack_5d0 = uStack_670;
              uStack_5c8 = uStack_668;
              fStack_5a4 = fStack_5e4;
            }
          }
        }
      }
    }
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 2) {
      local_1268 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_a78,1);
      for (local_126c = 0; local_126c < local_a9c; local_126c = local_126c + 1) {
        ncnn::Mat::channel(in_stack_ffffffffffffd790,(int)((ulong)in_stack_ffffffffffffd788 >> 0x20)
                          );
        pauVar25 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_12c0);
        ncnn::Mat::~Mat((Mat *)0x38744a);
        local_1278 = pauVar25;
        ncnn::Mat::channel(in_stack_ffffffffffffd790,(int)((ulong)in_stack_ffffffffffffd788 >> 0x20)
                          );
        pauVar25 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_1310);
        ncnn::Mat::~Mat((Mat *)0x3874a2);
        local_12c8 = pauVar25;
        ncnn::Mat::channel(in_stack_ffffffffffffd790,(int)((ulong)in_stack_ffffffffffffd788 >> 0x20)
                          );
        pauVar25 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_1360);
        ncnn::Mat::~Mat((Mat *)0x3874fa);
        local_1318 = pauVar25;
        for (local_1364 = 0; local_1364 < local_aa4; local_1364 = local_1364 + 1) {
          local_a48 = local_1278;
          auVar22 = *(undefined1 (*) [24])*local_1278;
          uStack_448 = *(undefined8 *)(*local_1278 + 0x18);
          local_a50 = local_12c8;
          local_13c0 = *(undefined8 *)*local_12c8;
          uStack_13b8 = *(undefined8 *)(*local_12c8 + 8);
          uStack_13b0 = *(undefined8 *)(*local_12c8 + 0x10);
          uStack_13a8 = *(undefined8 *)(*local_12c8 + 0x18);
          local_13a0._0_8_ = auVar22._0_8_;
          local_460 = local_13a0._0_8_;
          local_13a0._8_8_ = auVar22._8_8_;
          uStack_458 = local_13a0._8_8_;
          local_13a0._16_8_ = auVar22._16_8_;
          uStack_450 = local_13a0._16_8_;
          local_13a0 = vmaxps_avx(*local_1278,*local_12c8);
          local_8a8 = local_1318;
          local_8e0 = local_13a0._0_8_;
          uStack_8d8 = local_13a0._8_8_;
          uStack_8d0 = local_13a0._16_8_;
          uStack_8c8 = local_13a0._24_8_;
          *local_1318 = local_13a0;
          local_1278 = local_1278 + 1;
          local_12c8 = local_12c8 + 1;
          local_1318 = local_1318 + 1;
          local_480 = local_13c0;
          uStack_478 = uStack_13b8;
          uStack_470 = uStack_13b0;
          uStack_468 = uStack_13a8;
        }
      }
      for (local_13c8 = 2; uVar29 = local_13c8,
          sVar26 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_a78),
          uVar29 < sVar26; local_13c8 = local_13c8 + 1) {
        local_13d0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                               (local_a78,local_13c8);
        for (local_13d4 = 0; local_13d4 < local_a9c; local_13d4 = local_13d4 + 1) {
          ncnn::Mat::channel(in_stack_ffffffffffffd790,
                             (int)((ulong)in_stack_ffffffffffffd788 >> 0x20));
          pauVar25 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_1428);
          ncnn::Mat::~Mat((Mat *)0x387790);
          local_13e0 = pauVar25;
          ncnn::Mat::channel(in_stack_ffffffffffffd790,
                             (int)((ulong)in_stack_ffffffffffffd788 >> 0x20));
          pauVar25 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_1478);
          ncnn::Mat::~Mat((Mat *)0x3877e8);
          local_1430 = pauVar25;
          for (local_147c = 0; local_147c < local_aa4; local_147c = local_147c + 1) {
            local_a58 = local_1430;
            auVar22 = *(undefined1 (*) [24])*local_1430;
            uStack_488 = *(undefined8 *)(*local_1430 + 0x18);
            local_a60 = local_13e0;
            local_14c0 = *(undefined8 *)*local_13e0;
            uStack_14b8 = *(undefined8 *)(*local_13e0 + 8);
            uStack_14b0 = *(undefined8 *)(*local_13e0 + 0x10);
            uStack_14a8 = *(undefined8 *)(*local_13e0 + 0x18);
            local_14a0._0_8_ = auVar22._0_8_;
            local_4a0 = local_14a0._0_8_;
            local_14a0._8_8_ = auVar22._8_8_;
            uStack_498 = local_14a0._8_8_;
            local_14a0._16_8_ = auVar22._16_8_;
            uStack_490 = local_14a0._16_8_;
            local_14a0 = vmaxps_avx(*local_1430,*local_13e0);
            local_8e8 = local_1430;
            local_920 = local_14a0._0_8_;
            uStack_918 = local_14a0._8_8_;
            uStack_910 = local_14a0._16_8_;
            uStack_908 = local_14a0._24_8_;
            *local_1430 = local_14a0;
            local_13e0 = local_13e0 + 1;
            local_1430 = local_1430 + 1;
            local_4c0 = local_14c0;
            uStack_4b8 = uStack_14b8;
            uStack_4b0 = uStack_14b0;
            uStack_4a8 = uStack_14a8;
          }
        }
      }
    }
    local_a64 = 0;
  }
  else if (local_aa0 == 4) {
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 0) {
      local_14c8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_a78,1);
      for (local_14cc = 0; local_14cc < local_a9c; local_14cc = local_14cc + 1) {
        ncnn::Mat::channel(in_stack_ffffffffffffd790,(int)((ulong)in_stack_ffffffffffffd788 >> 0x20)
                          );
        pauVar27 = (undefined1 (*) [12])ncnn::Mat::operator_cast_to_float_(&local_1520);
        ncnn::Mat::~Mat((Mat *)0x387a56);
        local_14d8 = pauVar27;
        ncnn::Mat::channel(in_stack_ffffffffffffd790,(int)((ulong)in_stack_ffffffffffffd788 >> 0x20)
                          );
        pfVar24 = ncnn::Mat::operator_cast_to_float_(&local_1570);
        ncnn::Mat::~Mat((Mat *)0x387aae);
        local_1528 = pfVar24;
        ncnn::Mat::channel(in_stack_ffffffffffffd790,(int)((ulong)in_stack_ffffffffffffd788 >> 0x20)
                          );
        pauVar28 = (undefined1 (*) [16])ncnn::Mat::operator_cast_to_float_(&local_15c0);
        ncnn::Mat::~Mat((Mat *)0x387b06);
        local_1578 = pauVar28;
        for (local_15c4 = 0; local_15c4 < local_aa4; local_15c4 = local_15c4 + 1) {
          local_3c8 = local_14d8;
          auVar21 = *local_14d8;
          fStack_15d4 = (float)((ulong)*(undefined8 *)(*local_14d8 + 8) >> 0x20);
          local_3d0 = local_1528;
          local_15f0 = *(undefined8 *)local_1528;
          uStack_15e8 = *(undefined8 *)(local_1528 + 2);
          auVar1._12_4_ = fStack_15d4;
          auVar1._0_12_ = auVar21;
          local_330._0_4_ = auVar21._0_4_;
          local_330._4_4_ = auVar21._4_4_;
          fStack_328 = auVar21._8_4_;
          local_340._0_4_ = (float)local_15f0;
          local_340._4_4_ = (float)((ulong)local_15f0 >> 0x20);
          uStack_338._0_4_ = (float)uStack_15e8;
          uStack_338._4_4_ = (float)((ulong)uStack_15e8 >> 0x20);
          local_15e0 = (float)local_330._0_4_ * (float)local_340;
          fStack_15dc = (float)local_330._4_4_ * local_340._4_4_;
          fStack_15d8 = fStack_328 * (float)uStack_338;
          fStack_15d4 = fStack_15d4 * uStack_338._4_4_;
          local_228 = local_1578;
          local_240 = CONCAT44(fStack_15dc,local_15e0);
          uStack_238 = CONCAT44(fStack_15d4,fStack_15d8);
          auVar2._8_8_ = uStack_238;
          auVar2._0_8_ = local_240;
          *local_1578 = auVar2;
          local_14d8 = (undefined1 (*) [12])(local_14d8[1] + 4);
          local_1528 = local_1528 + 4;
          local_1578 = local_1578 + 1;
          local_340 = local_15f0;
          uStack_338 = uStack_15e8;
          _local_330 = auVar1;
        }
      }
      for (local_15f8 = 2; uVar29 = local_15f8,
          sVar26 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_a78),
          uVar29 < sVar26; local_15f8 = local_15f8 + 1) {
        local_1600 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                               (local_a78,local_15f8);
        for (local_1604 = 0; local_1604 < local_a9c; local_1604 = local_1604 + 1) {
          ncnn::Mat::channel(in_stack_ffffffffffffd790,
                             (int)((ulong)in_stack_ffffffffffffd788 >> 0x20));
          pfVar24 = ncnn::Mat::operator_cast_to_float_(&local_1658);
          ncnn::Mat::~Mat((Mat *)0x387d92);
          local_1610 = pfVar24;
          ncnn::Mat::channel(in_stack_ffffffffffffd790,
                             (int)((ulong)in_stack_ffffffffffffd788 >> 0x20));
          pauVar28 = (undefined1 (*) [16])ncnn::Mat::operator_cast_to_float_(&local_16a8);
          ncnn::Mat::~Mat((Mat *)0x387dea);
          local_1660 = pauVar28;
          for (local_16ac = 0; local_16ac < local_aa4; local_16ac = local_16ac + 1) {
            local_3d8 = local_1660;
            auVar21 = *(undefined1 (*) [12])*local_1660;
            fStack_16b4 = (float)((ulong)*(undefined8 *)(*local_1660 + 8) >> 0x20);
            local_3e0 = local_1610;
            local_16d0 = *(undefined8 *)local_1610;
            uStack_16c8 = *(undefined8 *)(local_1610 + 2);
            auVar9._12_4_ = fStack_16b4;
            auVar9._0_12_ = auVar21;
            local_350._0_4_ = auVar21._0_4_;
            local_350._4_4_ = auVar21._4_4_;
            fStack_348 = auVar21._8_4_;
            local_360._0_4_ = (float)local_16d0;
            local_360._4_4_ = (float)((ulong)local_16d0 >> 0x20);
            uStack_358._0_4_ = (float)uStack_16c8;
            uStack_358._4_4_ = (float)((ulong)uStack_16c8 >> 0x20);
            local_16c0 = (float)local_350._0_4_ * (float)local_360;
            fStack_16bc = (float)local_350._4_4_ * local_360._4_4_;
            fStack_16b8 = fStack_348 * (float)uStack_358;
            fStack_16b4 = fStack_16b4 * uStack_358._4_4_;
            local_248 = local_1660;
            local_260 = CONCAT44(fStack_16bc,local_16c0);
            uStack_258 = CONCAT44(fStack_16b4,fStack_16b8);
            auVar20._8_8_ = uStack_258;
            auVar20._0_8_ = local_260;
            *local_1660 = auVar20;
            local_1610 = local_1610 + 4;
            local_1660 = local_1660 + 1;
            local_360 = local_16d0;
            uStack_358 = uStack_16c8;
            _local_350 = auVar9;
          }
        }
      }
    }
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 1) {
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x104) == 0) {
        local_16d8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_a78,1);
        for (local_16dc = 0; local_16dc < local_a9c; local_16dc = local_16dc + 1) {
          ncnn::Mat::channel(in_stack_ffffffffffffd790,
                             (int)((ulong)in_stack_ffffffffffffd788 >> 0x20));
          pauVar27 = (undefined1 (*) [12])ncnn::Mat::operator_cast_to_float_(&local_1730);
          ncnn::Mat::~Mat((Mat *)0x388053);
          local_16e8 = pauVar27;
          ncnn::Mat::channel(in_stack_ffffffffffffd790,
                             (int)((ulong)in_stack_ffffffffffffd788 >> 0x20));
          pfVar24 = ncnn::Mat::operator_cast_to_float_(&local_1780);
          ncnn::Mat::~Mat((Mat *)0x3880ab);
          local_1738 = pfVar24;
          ncnn::Mat::channel(in_stack_ffffffffffffd790,
                             (int)((ulong)in_stack_ffffffffffffd788 >> 0x20));
          pauVar28 = (undefined1 (*) [16])ncnn::Mat::operator_cast_to_float_(&local_17d0);
          ncnn::Mat::~Mat((Mat *)0x388103);
          local_1788 = pauVar28;
          for (local_17d4 = 0; local_17d4 < local_aa4; local_17d4 = local_17d4 + 1) {
            local_3e8 = local_16e8;
            auVar21 = *local_16e8;
            fStack_17e4 = (float)((ulong)*(undefined8 *)(*local_16e8 + 8) >> 0x20);
            local_3f0 = local_1738;
            local_1800 = *(undefined8 *)local_1738;
            uStack_17f8 = *(undefined8 *)(local_1738 + 2);
            auVar8._12_4_ = fStack_17e4;
            auVar8._0_12_ = auVar21;
            local_1b0._0_4_ = auVar21._0_4_;
            local_1b0._4_4_ = auVar21._4_4_;
            fStack_1a8 = auVar21._8_4_;
            local_1c0._0_4_ = (float)local_1800;
            local_1c0._4_4_ = (float)((ulong)local_1800 >> 0x20);
            uStack_1b8._0_4_ = (float)uStack_17f8;
            uStack_1b8._4_4_ = (float)((ulong)uStack_17f8 >> 0x20);
            local_17f0 = (float)local_1b0._0_4_ + (float)local_1c0;
            fStack_17ec = (float)local_1b0._4_4_ + local_1c0._4_4_;
            fStack_17e8 = fStack_1a8 + (float)uStack_1b8;
            fStack_17e4 = fStack_17e4 + uStack_1b8._4_4_;
            local_268 = local_1788;
            local_280 = CONCAT44(fStack_17ec,local_17f0);
            uStack_278 = CONCAT44(fStack_17e4,fStack_17e8);
            auVar19._8_8_ = uStack_278;
            auVar19._0_8_ = local_280;
            *local_1788 = auVar19;
            local_16e8 = (undefined1 (*) [12])(local_16e8[1] + 4);
            local_1738 = local_1738 + 4;
            local_1788 = local_1788 + 1;
            local_1c0 = local_1800;
            uStack_1b8 = uStack_17f8;
            _local_1b0 = auVar8;
          }
        }
        for (local_1808 = 2; uVar29 = local_1808,
            sVar26 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_a78),
            uVar29 < sVar26; local_1808 = local_1808 + 1) {
          local_1810 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                 (local_a78,local_1808);
          for (local_1814 = 0; local_1814 < local_a9c; local_1814 = local_1814 + 1) {
            ncnn::Mat::channel(in_stack_ffffffffffffd790,
                               (int)((ulong)in_stack_ffffffffffffd788 >> 0x20));
            pfVar24 = ncnn::Mat::operator_cast_to_float_(&local_1868);
            ncnn::Mat::~Mat((Mat *)0x38838f);
            local_1820 = pfVar24;
            ncnn::Mat::channel(in_stack_ffffffffffffd790,
                               (int)((ulong)in_stack_ffffffffffffd788 >> 0x20));
            pauVar28 = (undefined1 (*) [16])ncnn::Mat::operator_cast_to_float_(&local_18b8);
            ncnn::Mat::~Mat((Mat *)0x3883e7);
            local_1870 = pauVar28;
            for (local_18bc = 0; local_18bc < local_aa4; local_18bc = local_18bc + 1) {
              local_3f8 = local_1870;
              auVar21 = *(undefined1 (*) [12])*local_1870;
              fStack_18c4 = (float)((ulong)*(undefined8 *)(*local_1870 + 8) >> 0x20);
              local_400 = local_1820;
              local_18e0 = *(undefined8 *)local_1820;
              uStack_18d8 = *(undefined8 *)(local_1820 + 2);
              auVar7._12_4_ = fStack_18c4;
              auVar7._0_12_ = auVar21;
              local_1d0._0_4_ = auVar21._0_4_;
              local_1d0._4_4_ = auVar21._4_4_;
              fStack_1c8 = auVar21._8_4_;
              local_1e0._0_4_ = (float)local_18e0;
              local_1e0._4_4_ = (float)((ulong)local_18e0 >> 0x20);
              uStack_1d8._0_4_ = (float)uStack_18d8;
              uStack_1d8._4_4_ = (float)((ulong)uStack_18d8 >> 0x20);
              local_18d0 = (float)local_1d0._0_4_ + (float)local_1e0;
              fStack_18cc = (float)local_1d0._4_4_ + local_1e0._4_4_;
              fStack_18c8 = fStack_1c8 + (float)uStack_1d8;
              fStack_18c4 = fStack_18c4 + uStack_1d8._4_4_;
              local_288 = local_1870;
              local_2a0 = CONCAT44(fStack_18cc,local_18d0);
              uStack_298 = CONCAT44(fStack_18c4,fStack_18c8);
              auVar18._8_8_ = uStack_298;
              auVar18._0_8_ = local_2a0;
              *local_1870 = auVar18;
              local_1820 = local_1820 + 4;
              local_1870 = local_1870 + 1;
              local_1e0 = local_18e0;
              uStack_1d8 = uStack_18d8;
              _local_1d0 = auVar7;
            }
          }
        }
      }
      else {
        local_18e8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_a78,1);
        pfVar24 = ncnn::Mat::operator[]((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8),0)
        ;
        local_160 = *pfVar24;
        local_1900 = CONCAT44(local_160,local_160);
        uStack_18f8 = CONCAT44(local_160,local_160);
        fStack_15c = local_160;
        fStack_158 = local_160;
        fStack_154 = local_160;
        local_144 = local_160;
        pfVar24 = ncnn::Mat::operator[]((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8),1)
        ;
        local_180 = *pfVar24;
        local_1910._4_4_ = local_180;
        local_1910._0_4_ = local_180;
        local_1910._8_4_ = local_180;
        local_1910._12_4_ = local_180;
        fStack_17c = local_180;
        fStack_178 = local_180;
        fStack_174 = local_180;
        local_164 = local_180;
        for (local_1914 = 0; local_1914 < local_a9c; local_1914 = local_1914 + 1) {
          ncnn::Mat::channel(in_stack_ffffffffffffd790,
                             (int)((ulong)in_stack_ffffffffffffd788 >> 0x20));
          pfVar24 = ncnn::Mat::operator_cast_to_float_(&local_1968);
          ncnn::Mat::~Mat((Mat *)0x3886cf);
          local_1920 = pfVar24;
          ncnn::Mat::channel(in_stack_ffffffffffffd790,
                             (int)((ulong)in_stack_ffffffffffffd788 >> 0x20));
          pfVar24 = ncnn::Mat::operator_cast_to_float_(&local_19b8);
          ncnn::Mat::~Mat((Mat *)0x388727);
          local_1970 = pfVar24;
          ncnn::Mat::channel(in_stack_ffffffffffffd790,
                             (int)((ulong)in_stack_ffffffffffffd788 >> 0x20));
          pauVar28 = (undefined1 (*) [16])ncnn::Mat::operator_cast_to_float_(&local_1a08);
          ncnn::Mat::~Mat((Mat *)0x38877f);
          local_19c0 = pauVar28;
          for (local_1a0c = 0; local_1a0c < local_aa4; local_1a0c = local_1a0c + 1) {
            local_408 = local_1920;
            uVar3 = *(undefined8 *)local_1920;
            uVar4 = *(undefined8 *)(local_1920 + 2);
            local_410 = local_1970;
            uVar5 = *(undefined8 *)local_1970;
            uVar6 = *(undefined8 *)(local_1970 + 2);
            local_370._0_4_ = (float)uVar3;
            local_370._4_4_ = (float)((ulong)uVar3 >> 0x20);
            uStack_368._0_4_ = (float)uVar4;
            uStack_368._4_4_ = (float)((ulong)uVar4 >> 0x20);
            local_380._0_4_ = (float)local_1900;
            local_380._4_4_ = (float)((ulong)local_1900 >> 0x20);
            uStack_378._0_4_ = (float)uStack_18f8;
            uStack_378._4_4_ = (float)((ulong)uStack_18f8 >> 0x20);
            local_1a20 = CONCAT44(local_370._4_4_ * local_380._4_4_,
                                  (float)local_370 * (float)local_380);
            uStack_1a18 = CONCAT44(uStack_368._4_4_ * uStack_378._4_4_,
                                   (float)uStack_368 * (float)uStack_378);
            local_390._0_4_ = (float)uVar5;
            local_390._4_4_ = (float)((ulong)uVar5 >> 0x20);
            uStack_388._0_4_ = (float)uVar6;
            uStack_388._4_4_ = (float)((ulong)uVar6 >> 0x20);
            local_3a0._0_4_ = local_1910._0_4_;
            local_3a0._4_4_ = local_1910._4_4_;
            uStack_398._0_4_ = local_1910._8_4_;
            uStack_398._4_4_ = local_1910._12_4_;
            local_1a30 = (float)local_390 * (float)local_3a0;
            fStack_1a2c = local_390._4_4_ * local_3a0._4_4_;
            fStack_1a28 = (float)uStack_388 * (float)uStack_398;
            fStack_1a24 = uStack_388._4_4_ * uStack_398._4_4_;
            local_1f0._4_4_ = fStack_1a2c;
            local_1f0._0_4_ = local_1a30;
            local_1f0._8_4_ = fStack_1a28;
            local_1f0._12_4_ = fStack_1a24;
            local_200 = local_1a20;
            uStack_1f8 = uStack_1a18;
            local_1a20 = CONCAT44(fStack_1a2c + local_370._4_4_ * local_380._4_4_,
                                  local_1a30 + (float)local_370 * (float)local_380);
            uStack_1a18 = CONCAT44(fStack_1a24 + uStack_368._4_4_ * uStack_378._4_4_,
                                   fStack_1a28 + (float)uStack_368 * (float)uStack_378);
            local_2a8 = local_19c0;
            local_2c0 = local_1a20;
            uStack_2b8 = uStack_1a18;
            auVar17._8_8_ = uStack_1a18;
            auVar17._0_8_ = local_1a20;
            *local_19c0 = auVar17;
            local_1920 = local_1920 + 4;
            local_1970 = local_1970 + 4;
            local_19c0 = local_19c0 + 1;
            local_3a0 = local_1910._0_8_;
            uStack_398 = local_1910._8_8_;
            local_390 = uVar5;
            uStack_388 = uVar6;
            local_380 = local_1900;
            uStack_378 = uStack_18f8;
            local_370 = uVar3;
            uStack_368 = uVar4;
          }
        }
        for (local_1a38 = 2; uVar29 = local_1a38,
            sVar26 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_a78),
            uVar29 < sVar26; local_1a38 = local_1a38 + 1) {
          local_1a40 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                 (local_a78,local_1a38);
          pfVar24 = ncnn::Mat::operator[]
                              ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8),local_1a38)
          ;
          local_1a0 = *pfVar24;
          local_1a50._4_4_ = local_1a0;
          local_1a50._0_4_ = local_1a0;
          local_1a50._8_4_ = local_1a0;
          local_1a50._12_4_ = local_1a0;
          fStack_19c = local_1a0;
          fStack_198 = local_1a0;
          fStack_194 = local_1a0;
          local_184 = local_1a0;
          for (local_1a54 = 0; local_1a54 < local_a9c; local_1a54 = local_1a54 + 1) {
            ncnn::Mat::channel(in_stack_ffffffffffffd790,
                               (int)((ulong)in_stack_ffffffffffffd788 >> 0x20));
            pfVar24 = ncnn::Mat::operator_cast_to_float_(&local_1aa8);
            ncnn::Mat::~Mat((Mat *)0x388ae2);
            local_1a60 = pfVar24;
            ncnn::Mat::channel(in_stack_ffffffffffffd790,
                               (int)((ulong)in_stack_ffffffffffffd788 >> 0x20));
            pauVar28 = (undefined1 (*) [16])ncnn::Mat::operator_cast_to_float_(&local_1af8);
            ncnn::Mat::~Mat((Mat *)0x388b3a);
            local_1ab0 = pauVar28;
            for (local_1afc = 0; local_1afc < local_aa4; local_1afc = local_1afc + 1) {
              local_418 = local_1a60;
              uVar3 = *(undefined8 *)local_1a60;
              uVar4 = *(undefined8 *)(local_1a60 + 2);
              local_420 = local_1ab0;
              uVar5 = *(undefined8 *)*local_1ab0;
              uVar6 = *(undefined8 *)(*local_1ab0 + 8);
              local_3b0._0_4_ = (float)uVar3;
              local_3b0._4_4_ = (float)((ulong)uVar3 >> 0x20);
              uStack_3a8._0_4_ = (float)uVar4;
              uStack_3a8._4_4_ = (float)((ulong)uVar4 >> 0x20);
              local_3c0._0_4_ = local_1a50._0_4_;
              local_3c0._4_4_ = local_1a50._4_4_;
              uStack_3b8._0_4_ = local_1a50._8_4_;
              uStack_3b8._4_4_ = local_1a50._12_4_;
              local_1b10 = (float)local_3b0 * (float)local_3c0;
              fStack_1b0c = local_3b0._4_4_ * local_3c0._4_4_;
              fStack_1b08 = (float)uStack_3a8 * (float)uStack_3b8;
              fStack_1b04 = uStack_3a8._4_4_ * uStack_3b8._4_4_;
              local_210._4_4_ = fStack_1b0c;
              local_210._0_4_ = local_1b10;
              local_210._8_4_ = fStack_1b08;
              local_210._12_4_ = fStack_1b04;
              local_220._0_4_ = (float)uVar5;
              local_220._4_4_ = (float)((ulong)uVar5 >> 0x20);
              uStack_218._0_4_ = (float)uVar6;
              uStack_218._4_4_ = (float)((ulong)uVar6 >> 0x20);
              local_1b20 = CONCAT44(fStack_1b0c + local_220._4_4_,local_1b10 + (float)local_220);
              uStack_1b18 = CONCAT44(fStack_1b04 + uStack_218._4_4_,fStack_1b08 + (float)uStack_218)
              ;
              local_2c8 = local_1ab0;
              local_2e0 = local_1b20;
              uStack_2d8 = uStack_1b18;
              auVar16._8_8_ = uStack_1b18;
              auVar16._0_8_ = local_1b20;
              *local_1ab0 = auVar16;
              local_1a60 = local_1a60 + 4;
              local_1ab0 = local_1ab0 + 1;
              local_3c0 = local_1a50._0_8_;
              uStack_3b8 = local_1a50._8_8_;
              local_3b0 = uVar3;
              uStack_3a8 = uVar4;
              local_220 = uVar5;
              uStack_218 = uVar6;
            }
          }
        }
      }
    }
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 2) {
      local_1b28 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_a78,1);
      for (local_1b2c = 0; local_1b2c < local_a9c; local_1b2c = local_1b2c + 1) {
        ncnn::Mat::channel(in_stack_ffffffffffffd790,(int)((ulong)in_stack_ffffffffffffd788 >> 0x20)
                          );
        pauVar28 = (undefined1 (*) [16])ncnn::Mat::operator_cast_to_float_(&local_1b80);
        ncnn::Mat::~Mat((Mat *)0x388dc7);
        local_1b38 = pauVar28;
        ncnn::Mat::channel(in_stack_ffffffffffffd790,(int)((ulong)in_stack_ffffffffffffd788 >> 0x20)
                          );
        pauVar28 = (undefined1 (*) [16])ncnn::Mat::operator_cast_to_float_(&local_1bd0);
        ncnn::Mat::~Mat((Mat *)0x388e1f);
        local_1b88 = pauVar28;
        ncnn::Mat::channel(in_stack_ffffffffffffd790,(int)((ulong)in_stack_ffffffffffffd788 >> 0x20)
                          );
        pauVar28 = (undefined1 (*) [16])ncnn::Mat::operator_cast_to_float_(&local_1c20);
        ncnn::Mat::~Mat((Mat *)0x388e77);
        local_1bd8 = pauVar28;
        for (local_1c24 = 0; local_1c24 < local_aa4; local_1c24 = local_1c24 + 1) {
          local_428 = local_1b38;
          local_110 = *(undefined8 *)*local_1b38;
          uStack_108 = *(undefined8 *)(*local_1b38 + 8);
          local_430 = local_1b88;
          local_1c50 = *(undefined8 *)*local_1b88;
          uStack_1c48 = *(undefined8 *)(*local_1b88 + 8);
          local_1c40 = vmaxps_avx(*local_1b38,*local_1b88);
          local_2e8 = local_1bd8;
          local_300 = local_1c40._0_8_;
          uStack_2f8 = local_1c40._8_8_;
          *local_1bd8 = local_1c40;
          local_1b38 = local_1b38 + 1;
          local_1b88 = local_1b88 + 1;
          local_1bd8 = local_1bd8 + 1;
          local_120 = local_1c50;
          uStack_118 = uStack_1c48;
        }
      }
      for (local_1c58 = 2; uVar29 = local_1c58,
          sVar26 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_a78),
          uVar29 < sVar26; local_1c58 = local_1c58 + 1) {
        local_1c60 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                               (local_a78,local_1c58);
        for (local_1c64 = 0; local_1c64 < local_a9c; local_1c64 = local_1c64 + 1) {
          ncnn::Mat::channel(in_stack_ffffffffffffd790,
                             (int)((ulong)in_stack_ffffffffffffd788 >> 0x20));
          pauVar28 = (undefined1 (*) [16])ncnn::Mat::operator_cast_to_float_(&local_1cb8);
          ncnn::Mat::~Mat((Mat *)0x389107);
          local_1c70 = pauVar28;
          ncnn::Mat::channel(in_stack_ffffffffffffd790,
                             (int)((ulong)in_stack_ffffffffffffd788 >> 0x20));
          pauVar28 = (undefined1 (*) [16])ncnn::Mat::operator_cast_to_float_(&local_1d08);
          ncnn::Mat::~Mat((Mat *)0x38915f);
          local_1cc0 = pauVar28;
          for (local_1d0c = 0; local_1d0c < local_aa4; local_1d0c = local_1d0c + 1) {
            local_438 = local_1cc0;
            local_130 = *(undefined8 *)*local_1cc0;
            uStack_128 = *(undefined8 *)(*local_1cc0 + 8);
            local_440 = local_1c70;
            local_1d30 = *(undefined8 *)*local_1c70;
            uStack_1d28 = *(undefined8 *)(*local_1c70 + 8);
            local_1d20 = vmaxps_avx(*local_1cc0,*local_1c70);
            local_308 = local_1cc0;
            local_320 = local_1d20._0_8_;
            uStack_318 = local_1d20._8_8_;
            *local_1cc0 = local_1d20;
            local_1c70 = local_1c70 + 1;
            local_1cc0 = local_1cc0 + 1;
            local_140 = local_1d30;
            uStack_138 = uStack_1d28;
          }
        }
      }
    }
    local_a64 = 0;
  }
  else {
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 0) {
      local_1d38 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_a78,1);
      for (local_1d3c = 0; local_1d3c < local_a9c; local_1d3c = local_1d3c + 1) {
        ncnn::Mat::channel(in_stack_ffffffffffffd790,(int)((ulong)in_stack_ffffffffffffd788 >> 0x20)
                          );
        pfVar24 = ncnn::Mat::operator_cast_to_float_(&local_1d90);
        ncnn::Mat::~Mat((Mat *)0x3893bf);
        local_1d48 = pfVar24;
        ncnn::Mat::channel(in_stack_ffffffffffffd790,(int)((ulong)in_stack_ffffffffffffd788 >> 0x20)
                          );
        pfVar24 = ncnn::Mat::operator_cast_to_float_(&local_1de0);
        ncnn::Mat::~Mat((Mat *)0x389417);
        local_1d98 = pfVar24;
        ncnn::Mat::channel(in_stack_ffffffffffffd790,(int)((ulong)in_stack_ffffffffffffd788 >> 0x20)
                          );
        pfVar24 = ncnn::Mat::operator_cast_to_float_(&local_1e30);
        ncnn::Mat::~Mat((Mat *)0x38946f);
        local_1de8 = pfVar24;
        for (local_1e34 = local_aa4; 0 < local_1e34; local_1e34 = local_1e34 + -1) {
          *local_1de8 = *local_1d48 * *local_1d98;
          local_1d48 = local_1d48 + 1;
          local_1d98 = local_1d98 + 1;
          local_1de8 = local_1de8 + 1;
        }
      }
      for (local_1e40 = 2; uVar29 = local_1e40,
          sVar26 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_a78),
          uVar29 < sVar26; local_1e40 = local_1e40 + 1) {
        local_1e48 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                               (local_a78,local_1e40);
        for (local_1e4c = 0; local_1e4c < local_a9c; local_1e4c = local_1e4c + 1) {
          ncnn::Mat::channel(in_stack_ffffffffffffd790,
                             (int)((ulong)in_stack_ffffffffffffd788 >> 0x20));
          pfVar24 = ncnn::Mat::operator_cast_to_float_(&local_1ea0);
          ncnn::Mat::~Mat((Mat *)0x38965c);
          local_1e58 = pfVar24;
          ncnn::Mat::channel(in_stack_ffffffffffffd790,
                             (int)((ulong)in_stack_ffffffffffffd788 >> 0x20));
          pfVar24 = ncnn::Mat::operator_cast_to_float_(&local_1ef0);
          ncnn::Mat::~Mat((Mat *)0x3896b4);
          local_1ea8 = pfVar24;
          for (local_1ef4 = local_aa4; 0 < local_1ef4; local_1ef4 = local_1ef4 + -1) {
            *local_1ea8 = *local_1e58 * *local_1ea8;
            local_1e58 = local_1e58 + 1;
            local_1ea8 = local_1ea8 + 1;
          }
        }
      }
    }
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 1) {
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x104) == 0) {
        local_1f00 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_a78,1);
        for (local_1f04 = 0; local_1f04 < local_a9c; local_1f04 = local_1f04 + 1) {
          ncnn::Mat::channel(in_stack_ffffffffffffd790,
                             (int)((ulong)in_stack_ffffffffffffd788 >> 0x20));
          pfVar24 = ncnn::Mat::operator_cast_to_float_(&local_1f58);
          ncnn::Mat::~Mat((Mat *)0x389873);
          local_1f10 = pfVar24;
          ncnn::Mat::channel(in_stack_ffffffffffffd790,
                             (int)((ulong)in_stack_ffffffffffffd788 >> 0x20));
          pfVar24 = ncnn::Mat::operator_cast_to_float_(&local_1fa8);
          ncnn::Mat::~Mat((Mat *)0x3898cb);
          local_1f60 = pfVar24;
          ncnn::Mat::channel(in_stack_ffffffffffffd790,
                             (int)((ulong)in_stack_ffffffffffffd788 >> 0x20));
          pfVar24 = ncnn::Mat::operator_cast_to_float_(&local_1ff8);
          ncnn::Mat::~Mat((Mat *)0x389923);
          local_1fb0 = pfVar24;
          for (local_1ffc = local_aa4; 0 < local_1ffc; local_1ffc = local_1ffc + -1) {
            *local_1fb0 = *local_1f10 + *local_1f60;
            local_1f10 = local_1f10 + 1;
            local_1f60 = local_1f60 + 1;
            local_1fb0 = local_1fb0 + 1;
          }
        }
        for (local_2008 = 2; uVar29 = local_2008,
            sVar26 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_a78),
            uVar29 < sVar26; local_2008 = local_2008 + 1) {
          local_2010 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                 (local_a78,local_2008);
          for (local_2014 = 0; local_2014 < local_a9c; local_2014 = local_2014 + 1) {
            ncnn::Mat::channel(in_stack_ffffffffffffd790,
                               (int)((ulong)in_stack_ffffffffffffd788 >> 0x20));
            pfVar24 = ncnn::Mat::operator_cast_to_float_(&local_2068);
            ncnn::Mat::~Mat((Mat *)0x389b10);
            local_2020 = pfVar24;
            ncnn::Mat::channel(in_stack_ffffffffffffd790,
                               (int)((ulong)in_stack_ffffffffffffd788 >> 0x20));
            pfVar24 = ncnn::Mat::operator_cast_to_float_(&local_20b8);
            ncnn::Mat::~Mat((Mat *)0x389b68);
            local_2070 = pfVar24;
            for (local_20bc = local_aa4; 0 < local_20bc; local_20bc = local_20bc + -1) {
              *local_2070 = *local_2020 + *local_2070;
              local_2020 = local_2020 + 1;
              local_2070 = local_2070 + 1;
            }
          }
        }
      }
      else {
        local_20c8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_a78,1);
        pfVar24 = ncnn::Mat::operator[]((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8),0)
        ;
        local_20cc = *pfVar24;
        pfVar24 = ncnn::Mat::operator[]((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8),1)
        ;
        local_20d0 = *pfVar24;
        for (local_20d4 = 0; local_20d4 < local_a9c; local_20d4 = local_20d4 + 1) {
          ncnn::Mat::channel(in_stack_ffffffffffffd790,
                             (int)((ulong)in_stack_ffffffffffffd788 >> 0x20));
          pfVar24 = ncnn::Mat::operator_cast_to_float_(&local_2128);
          ncnn::Mat::~Mat((Mat *)0x389d49);
          local_20e0 = pfVar24;
          ncnn::Mat::channel(in_stack_ffffffffffffd790,
                             (int)((ulong)in_stack_ffffffffffffd788 >> 0x20));
          pfVar24 = ncnn::Mat::operator_cast_to_float_(&local_2178);
          ncnn::Mat::~Mat((Mat *)0x389da1);
          local_2130 = pfVar24;
          ncnn::Mat::channel(in_stack_ffffffffffffd790,
                             (int)((ulong)in_stack_ffffffffffffd788 >> 0x20));
          pfVar24 = ncnn::Mat::operator_cast_to_float_(&local_21c8);
          ncnn::Mat::~Mat((Mat *)0x389df9);
          local_2180 = pfVar24;
          for (local_21cc = local_aa4; 0 < local_21cc; local_21cc = local_21cc + -1) {
            *local_2180 = *local_20e0 * local_20cc + *local_2130 * local_20d0;
            local_20e0 = local_20e0 + 1;
            local_2130 = local_2130 + 1;
            local_2180 = local_2180 + 1;
          }
        }
        for (local_21d8 = 2; uVar29 = local_21d8,
            sVar26 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_a78),
            uVar29 < sVar26; local_21d8 = local_21d8 + 1) {
          local_21e0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                 (local_a78,local_21d8);
          pfVar24 = ncnn::Mat::operator[]
                              ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8),local_21d8)
          ;
          local_21e4 = *pfVar24;
          for (local_21e8 = 0; local_21e8 < local_a9c; local_21e8 = local_21e8 + 1) {
            ncnn::Mat::channel(in_stack_ffffffffffffd790,
                               (int)((ulong)in_stack_ffffffffffffd788 >> 0x20));
            pfVar24 = ncnn::Mat::operator_cast_to_float_(&local_2238);
            ncnn::Mat::~Mat((Mat *)0x38a01d);
            local_21f0 = pfVar24;
            ncnn::Mat::channel(in_stack_ffffffffffffd790,
                               (int)((ulong)in_stack_ffffffffffffd788 >> 0x20));
            pfVar24 = ncnn::Mat::operator_cast_to_float_(&local_2288);
            ncnn::Mat::~Mat((Mat *)0x38a069);
            local_2240 = pfVar24;
            for (local_228c = local_aa4; 0 < local_228c; local_228c = local_228c + -1) {
              *local_2240 = *local_21f0 * local_21e4 + *local_2240;
              local_21f0 = local_21f0 + 1;
              local_2240 = local_2240 + 1;
            }
          }
        }
      }
    }
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 2) {
      local_2298 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_a78,1);
      for (local_229c = 0; _c = (int)((ulong)in_stack_ffffffffffffd788 >> 0x20),
          local_229c < local_a9c; local_229c = local_229c + 1) {
        ncnn::Mat::channel(in_stack_ffffffffffffd790,_c);
        pfVar24 = ncnn::Mat::operator_cast_to_float_(&local_22f0);
        ncnn::Mat::~Mat((Mat *)0x38a20a);
        local_22a8 = pfVar24;
        ncnn::Mat::channel(in_stack_ffffffffffffd790,_c);
        pfVar24 = ncnn::Mat::operator_cast_to_float_(&local_2340);
        ncnn::Mat::~Mat((Mat *)0x38a256);
        in_stack_ffffffffffffd788 = &local_2390;
        local_22f8 = pfVar24;
        ncnn::Mat::channel(in_stack_ffffffffffffd790,(int)((ulong)in_stack_ffffffffffffd788 >> 0x20)
                          );
        in_stack_ffffffffffffd790 =
             (Mat *)ncnn::Mat::operator_cast_to_float_(in_stack_ffffffffffffd788);
        ncnn::Mat::~Mat((Mat *)0x38a2a2);
        local_2348 = in_stack_ffffffffffffd790;
        for (local_2394 = local_aa4; 0 < local_2394; local_2394 = local_2394 + -1) {
          pfVar24 = std::max<float>(local_22a8,local_22f8);
          *(float *)&local_2348->data = *pfVar24;
          local_22a8 = local_22a8 + 1;
          local_22f8 = local_22f8 + 1;
          local_2348 = (Mat *)((long)&local_2348->data + 4);
        }
      }
      local_23a0 = 2;
      while (uVar29 = local_23a0,
            sVar26 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_a78),
            uVar29 < sVar26) {
        local_23a8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                               (local_a78,local_23a0);
        for (local_23ac = 0; local_23ac < local_a9c; local_23ac = local_23ac + 1) {
          ncnn::Mat::channel(in_stack_ffffffffffffd790,
                             (int)((ulong)in_stack_ffffffffffffd788 >> 0x20));
          pfVar24 = ncnn::Mat::operator_cast_to_float_(&local_2400);
          ncnn::Mat::~Mat((Mat *)0x38a47e);
          local_23b8 = pfVar24;
          ncnn::Mat::channel(in_stack_ffffffffffffd790,
                             (int)((ulong)in_stack_ffffffffffffd788 >> 0x20));
          pfVar24 = ncnn::Mat::operator_cast_to_float_(&local_2450);
          ncnn::Mat::~Mat((Mat *)0x38a4c8);
          local_2408 = pfVar24;
          for (local_2454 = local_aa4; 0 < local_2454; local_2454 = local_2454 + -1) {
            pfVar24 = std::max<float>(local_23b8,local_2408);
            *local_2408 = *pfVar24;
            local_23b8 = local_23b8 + 1;
            local_2408 = local_2408 + 1;
          }
        }
        local_23a0 = local_23a0 + 1;
      }
    }
    local_a64 = 0;
  }
  return local_a64;
}

Assistant:

int Eltwise_x86_avx::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;
    int size = w * h;

    Mat& top_blob = top_blobs[0];
    top_blob.create_like(bottom_blob, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

#if __SSE2__
#if __AVX__
    if (elempack == 8)
    {
        if (op_type == Operation_PROD)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_mul_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_mul_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
                }
            }
        }
        if (op_type == Operation_SUM)
        {
            if (coeffs.w == 0)
            {
                // first blob
                const Mat& bottom_blob1 = bottom_blobs[1];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    const float* ptr1 = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr1);
                        _p = _mm256_add_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        ptr1 += 8;
                        outptr += 8;
                    }
                }

                for (size_t b = 2; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob2 = bottom_blobs[b];
                    #pragma omp parallel for num_threads(opt.num_threads)
                    for (int q = 0; q < channels; q++)
                    {
                        const float* ptr = bottom_blob2.channel(q);
                        float* outptr = top_blob.channel(q);

                        for (int i = 0; i < size; i++)
                        {
                            __m256 _p = _mm256_loadu_ps(outptr);
                            __m256 _p1 = _mm256_loadu_ps(ptr);
                            _p = _mm256_add_ps(_p, _p1);
                            _mm256_storeu_ps(outptr, _p);

                            ptr += 8;
                            outptr += 8;
                        }
                    }
                }
            }
            else
            {
                // first blob
                const Mat& bottom_blob1 = bottom_blobs[1];
                __m256 _coeff0 = _mm256_set1_ps(coeffs[0]);
                __m256 _coeff1 = _mm256_set1_ps(coeffs[1]);
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    const float* ptr1 = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr1);
                        _p = _mm256_mul_ps(_p, _coeff0);
                        _p = _mm256_comp_fmadd_ps(_p1, _coeff1, _p);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        ptr1 += 8;
                        outptr += 8;
                    }
                }

                for (size_t b = 2; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob2 = bottom_blobs[b];
                    __m256 _coeff = _mm256_set1_ps(coeffs[b]);
                    #pragma omp parallel for num_threads(opt.num_threads)
                    for (int q = 0; q < channels; q++)
                    {
                        const float* ptr = bottom_blob2.channel(q);
                        float* outptr = top_blob.channel(q);

                        for (int i = 0; i < size; i++)
                        {
                            __m256 _p = _mm256_loadu_ps(outptr);
                            __m256 _p1 = _mm256_loadu_ps(ptr);
                            _p = _mm256_comp_fmadd_ps(_p1, _coeff, _p);
                            _mm256_storeu_ps(outptr, _p);

                            ptr += 8;
                            outptr += 8;
                        }
                    }
                }
            }
        }
        if (op_type == Operation_MAX)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_max_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_max_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (op_type == Operation_PROD)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_mul_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_load_ps(outptr);
                        __m128 _p1 = _mm_load_ps(ptr);
                        _p = _mm_mul_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
                }
            }
        }
        if (op_type == Operation_SUM)
        {
            if (coeffs.w == 0)
            {
                // first blob
                const Mat& bottom_blob1 = bottom_blobs[1];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    const float* ptr1 = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_load_ps(ptr);
                        __m128 _p1 = _mm_load_ps(ptr1);
                        _p = _mm_add_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        ptr1 += 4;
                        outptr += 4;
                    }
                }

                for (size_t b = 2; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob2 = bottom_blobs[b];
                    #pragma omp parallel for num_threads(opt.num_threads)
                    for (int q = 0; q < channels; q++)
                    {
                        const float* ptr = bottom_blob2.channel(q);
                        float* outptr = top_blob.channel(q);

                        for (int i = 0; i < size; i++)
                        {
                            __m128 _p = _mm_load_ps(outptr);
                            __m128 _p1 = _mm_load_ps(ptr);
                            _p = _mm_add_ps(_p, _p1);
                            _mm_store_ps(outptr, _p);

                            ptr += 4;
                            outptr += 4;
                        }
                    }
                }
            }
            else
            {
                // first blob
                const Mat& bottom_blob1 = bottom_blobs[1];
                __m128 _coeff0 = _mm_set1_ps(coeffs[0]);
                __m128 _coeff1 = _mm_set1_ps(coeffs[1]);
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    const float* ptr1 = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_load_ps(ptr);
                        __m128 _p1 = _mm_load_ps(ptr1);
                        _p = _mm_mul_ps(_p, _coeff0);
                        _p1 = _mm_mul_ps(_p1, _coeff1);
                        _p = _mm_add_ps(_p1, _p);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        ptr1 += 4;
                        outptr += 4;
                    }
                }

                for (size_t b = 2; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob2 = bottom_blobs[b];
                    __m128 _coeff = _mm_set1_ps(coeffs[b]);
                    #pragma omp parallel for num_threads(opt.num_threads)
                    for (int q = 0; q < channels; q++)
                    {
                        const float* ptr = bottom_blob2.channel(q);
                        float* outptr = top_blob.channel(q);

                        for (int i = 0; i < size; i++)
                        {
                            __m128 _p1 = _mm_load_ps(ptr);
                            __m128 _p = _mm_load_ps(outptr);
                            _p1 = _mm_mul_ps(_p1, _coeff);
                            _p = _mm_add_ps(_p1, _p);
                            _mm_store_ps(outptr, _p);

                            ptr += 4;
                            outptr += 4;
                        }
                    }
                }
            }
        }
        if (op_type == Operation_MAX)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_max_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_load_ps(outptr);
                        __m128 _p1 = _mm_load_ps(ptr);
                        _p = _mm_max_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    if (op_type == Operation_PROD)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);
            int remain = size;
            for (; remain > 0; remain--)
            {
                *outptr = *ptr * *ptr1;

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);
                int remain = size;

                for (; remain > 0; remain--)
                {
                    *outptr *= *ptr;

                    ptr++;
                    outptr++;
                }
            }
        }
    }
    if (op_type == Operation_SUM)
    {
        if (coeffs.w == 0)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);
                int remain = size;

                for (; remain > 0; remain--)
                {
                    *outptr = *ptr + *ptr1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    int remain = size;
                    for (; remain > 0; remain--)
                    {
                        *outptr += *ptr;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
        else
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            float coeff0 = coeffs[0];
            float coeff1 = coeffs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);
                int remain = size;
                for (; remain > 0; remain--)
                {
                    *outptr = *ptr * coeff0 + *ptr1 * coeff1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                float coeff = coeffs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    int remain = size;
                    for (; remain > 0; remain--)
                    {
                        *outptr += *ptr * coeff;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
    }
    if (op_type == Operation_MAX)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            int remain = size;
            for (; remain > 0; remain--)
            {
                *outptr = std::max(*ptr, *ptr1);

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);

                int remain = size;
                for (; remain > 0; remain--)
                {
                    *outptr = std::max(*ptr, *outptr);

                    ptr++;
                    outptr++;
                }
            }
        }
    }

    return 0;
}